

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# countdown_latch_test.cpp
# Opt level: O3

void __thiscall
bidfx_public_api::tools::CountdownLatchTest_TestCountdownLatchFromZeroDefiniteAwait_Test::TestBody
          (CountdownLatchTest_TestCountdownLatchFromZeroDefiniteAwait_Test *this)

{
  char cVar1;
  bool bVar2;
  long lVar3;
  long lVar4;
  char *message;
  char *in_R9;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  CountdownLatch latch;
  duration<long,_std::ratio<1L,_1000L>_> local_b0;
  duration<long,_std::ratio<1L,_1000000000L>_> local_a8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_a0;
  AssertHelper local_98;
  string local_90;
  CountdownLatch local_70 [96];
  
  bidfx_public_api::tools::CountdownLatch::CountdownLatch(local_70,0);
  lVar3 = std::chrono::_V2::system_clock::now();
  cVar1 = bidfx_public_api::tools::CountdownLatch::Await(local_70);
  local_a8.__r._0_1_ = cVar1;
  local_a0.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (cVar1 == '\0') {
    testing::Message::Message((Message *)&local_b0);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_90,(internal *)&local_a8,
               (AssertionResult *)"latch.Await(std::chrono::milliseconds(10000))","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_98,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x60,(char *)CONCAT71(local_90._M_dataplus._M_p._1_7_,
                                      (char)local_90._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_98,(Message *)&local_b0);
    testing::internal::AssertHelper::~AssertHelper(&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p) !=
        &local_90.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_90._M_dataplus._M_p._1_7_,(char)local_90._M_dataplus._M_p),
                      local_90.field_2._M_allocated_capacity + 1);
    }
    if ((long *)local_b0.__r != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_b0.__r != (long *)0x0)) {
        (**(code **)(*(long *)local_b0.__r + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_a0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  lVar4 = std::chrono::_V2::system_clock::now();
  local_a8.__r = lVar4 - lVar3;
  local_b0.__r = 10000;
  testing::internal::
  CmpHelperLT<std::chrono::duration<long,std::ratio<1l,1000000000l>>,std::chrono::duration<long,std::ratio<1l,1000l>>>
            ((internal *)&local_90,"end.time_since_epoch() - start.time_since_epoch()",
             "std::chrono::milliseconds(10000)",&local_a8,&local_b0);
  if ((char)local_90._M_dataplus._M_p == '\0') {
    testing::Message::Message((Message *)&local_a8);
    if ((undefined8 *)local_90._M_string_length == (undefined8 *)0x0) {
      message = "";
    }
    else {
      message = *(char **)local_90._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/bidfx[P]bidfx-api-cpp/test/tools/countdown_latch_test.cpp"
               ,0x62,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_b0,(Message *)&local_a8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_b0);
    if ((long *)local_a8.__r != (long *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) && ((long *)local_a8.__r != (long *)0x0)) {
        (**(code **)(*(long *)local_a8.__r + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_90._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::condition_variable::~condition_variable((condition_variable *)local_70);
  return;
}

Assistant:

TEST(CountdownLatchTest, TestCountdownLatchFromZeroDefiniteAwait)
{
    CountdownLatch latch = CountdownLatch(0);
    std::chrono::time_point<std::chrono::system_clock> start  = std::chrono::system_clock::now();
    EXPECT_TRUE(latch.Await(std::chrono::milliseconds(10000)));
    std::chrono::time_point<std::chrono::system_clock> end = std::chrono::system_clock::now();
    EXPECT_LT(end.time_since_epoch() - start.time_since_epoch(), std::chrono::milliseconds(10000));
}